

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idas_ls.c
# Opt level: O1

int IDASetLinearSolver(void *ida_mem,SUNLinearSolver LS,SUNMatrix A)

{
  double dVar1;
  uint uVar2;
  int iVar3;
  code *pcVar4;
  uint *__s;
  long lVar5;
  int iVar6;
  int iVar7;
  undefined8 uVar8;
  char *pcVar9;
  bool bVar10;
  uint local_38;
  
  if (ida_mem == (void *)0x0) {
    pcVar9 = "Integrator memory is NULL.";
    iVar6 = -1;
    ida_mem = (IDAMem)0x0;
    iVar7 = -1;
    iVar3 = 0x62;
LAB_00122fa9:
    IDAProcessError((IDAMem)ida_mem,iVar7,iVar3,"IDASetLinearSolver",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/idas/idas_ls.c"
                    ,pcVar9);
    return iVar6;
  }
  if (LS == (SUNLinearSolver)0x0) {
    pcVar9 = "LS must be non-NULL";
    iVar6 = -3;
    ida_mem = (IDAMem)0x0;
    iVar7 = -3;
    iVar3 = 0x68;
    goto LAB_00122fa9;
  }
  if ((LS->ops->gettype == (_func_SUNLinearSolver_Type_SUNLinearSolver *)0x0) ||
     (LS->ops->solve == (_func_int_SUNLinearSolver_SUNMatrix_N_Vector_N_Vector_sunrealtype *)0x0)) {
    pcVar9 = "LS object is missing a required operation";
    iVar6 = -3;
    iVar7 = -3;
    iVar3 = 0x71;
    goto LAB_00122fa9;
  }
  uVar2 = SUNLinSolGetType(LS);
  bVar10 = (uVar2 - 1 & 0xfffffffd) != 0;
  lVar5 = *(long *)(*(long *)((long)ida_mem + 0x2c8) + 8);
  if ((*(long *)(lVar5 + 0x60) == 0) || (*(long *)(lVar5 + 0xa8) == 0)) {
    pcVar9 = "A required vector operation is not implemented.";
    iVar6 = -3;
    iVar7 = -3;
    iVar3 = 0x82;
    goto LAB_00122fa9;
  }
  if (A != (SUNMatrix)0x0 && uVar2 == 3) {
    pcVar9 = "Incompatible inputs: matrix-embedded LS requires NULL matrix";
    iVar6 = -3;
    iVar7 = -3;
    iVar3 = 0x8a;
    goto LAB_00122fa9;
  }
  if (uVar2 == 0) {
    if (A == (SUNMatrix)0x0) {
      pcVar9 = "Incompatible inputs: direct LS requires non-NULL matrix";
      iVar6 = -3;
      iVar7 = -3;
      iVar3 = 0xb4;
      goto LAB_00122fa9;
    }
  }
  else {
    if (*(long *)(lVar5 + 0x48) == 0) {
      pcVar9 = "A required vector operation is not implemented.";
      iVar6 = -3;
      iVar7 = -3;
      iVar3 = 0x94;
      goto LAB_00122fa9;
    }
    if ((uVar2 != 3) &&
       ((LS->ops->resid == (_func_N_Vector_SUNLinearSolver *)0x0 ||
        (LS->ops->numiters == (_func_int_SUNLinearSolver *)0x0)))) {
      pcVar9 = "Iterative LS object requires \'resid\' and \'numiters\' routines";
      iVar6 = -3;
      iVar7 = -3;
      iVar3 = 0x9d;
      goto LAB_00122fa9;
    }
    if (((uVar2 != 3) != bVar10) &&
       (LS->ops->setatimes == (_func_SUNErrCode_SUNLinearSolver_void_ptr_SUNATimesFn *)0x0)) {
      pcVar9 = "Incompatible inputs: iterative LS must support ATimes routine";
      iVar6 = -3;
      iVar7 = -3;
      iVar3 = 0xa6;
      goto LAB_00122fa9;
    }
    if ((A == (SUNMatrix)0x0) && ((uVar2 | 2) != 3)) {
      pcVar9 = "Incompatible inputs: matrix-iterative LS requires non-NULL matrix";
      iVar6 = -3;
      iVar7 = -3;
      iVar3 = 0xad;
      goto LAB_00122fa9;
    }
  }
  if (*(code **)((long)ida_mem + 0x758) != (code *)0x0) {
    (**(code **)((long)ida_mem + 0x758))(ida_mem);
  }
  *(code **)((long)ida_mem + 0x738) = idaLsInitialize;
  *(code **)((long)ida_mem + 0x740) = idaLsSetup;
  *(code **)((long)ida_mem + 0x748) = idaLsSolve;
  *(code **)((long)ida_mem + 0x758) = idaLsFree;
  local_38 = (uint)(uVar2 != 0);
  if (uVar2 == 0) {
    pcVar4 = (code *)0x0;
  }
  else {
    pcVar4 = idaLsPerf;
  }
  *(code **)((long)ida_mem + 0x750) = pcVar4;
  __s = (uint *)malloc(0x148);
  if (__s == (uint *)0x0) {
    pcVar9 = "A memory request failed.";
    iVar6 = -4;
    iVar7 = -4;
    iVar3 = 0xca;
    goto LAB_00122fa9;
  }
  memset(__s,0,0x148);
  *(SUNLinearSolver *)(__s + 8) = LS;
  *__s = local_38;
  __s[1] = (uint)bVar10;
  *(SUNMatrix *)(__s + 10) = A;
  if (A == (SUNMatrix)0x0) {
    __s[2] = 0;
    __s[4] = 0;
    __s[5] = 0;
    __s[6] = 0;
    __s[7] = 0;
  }
  else {
    __s[2] = 1;
    *(code **)(__s + 4) = idaLsDQJac;
    *(void **)(__s + 6) = ida_mem;
  }
  __s[0x48] = 1;
  __s[0x4a] = 0;
  __s[0x4b] = 0;
  *(code **)(__s + 0x4c) = idaLsDQJtimes;
  *(undefined8 *)(__s + 0x4e) = *(undefined8 *)((long)ida_mem + 0x10);
  *(void **)(__s + 0x50) = ida_mem;
  __s[0x40] = 0;
  __s[0x41] = 0;
  __s[0x42] = 0;
  __s[0x43] = 0;
  __s[0x44] = 0;
  __s[0x45] = 0;
  *(undefined8 *)(__s + 0x46) = *(undefined8 *)((long)ida_mem + 0x18);
  __s[0x20] = 0;
  __s[0x21] = 0;
  __s[0x22] = 0;
  __s[0x23] = 0;
  __s[0x24] = 0;
  __s[0x25] = 0;
  __s[0x26] = 0;
  __s[0x27] = 0;
  __s[0x28] = 0;
  __s[0x29] = 0;
  __s[0x2a] = 0;
  __s[0x2b] = 0;
  __s[0x2c] = 0;
  __s[0x2d] = 0;
  __s[0x2e] = 0;
  __s[0x2f] = 0;
  __s[0x1a] = 0x9999999a;
  __s[0x1b] = 0x3fa99999;
  __s[0x1e] = 0;
  __s[0x1f] = 0x3ff00000;
  __s[0x3e] = 0;
  if ((LS->ops->setatimes == (_func_SUNErrCode_SUNLinearSolver_void_ptr_SUNATimesFn *)0x0) ||
     (iVar3 = SUNLinSolSetATimes(LS,ida_mem,idaLsATimes), iVar3 == 0)) {
    if ((LS->ops->setpreconditioner ==
         (_func_SUNErrCode_SUNLinearSolver_void_ptr_SUNPSetupFn_SUNPSolveFn *)0x0) ||
       (iVar3 = SUNLinSolSetPreconditioner(LS,ida_mem,0,0), iVar3 == 0)) {
      lVar5 = N_VClone(*(undefined8 *)((long)ida_mem + 0x2c8));
      *(long *)(__s + 0xc) = lVar5;
      if (lVar5 != 0) {
        lVar5 = N_VClone(*(undefined8 *)((long)ida_mem + 0x2c8));
        *(long *)(__s + 0xe) = lVar5;
        if (lVar5 == 0) {
          IDAProcessError((IDAMem)ida_mem,-4,0x123,"IDASetLinearSolver",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/idas/idas_ls.c"
                          ,"A memory request failed.");
          uVar8 = *(undefined8 *)(__s + 0xc);
        }
        else {
          lVar5 = N_VClone(*(undefined8 *)((long)ida_mem + 0x2c8));
          *(long *)(__s + 0x10) = lVar5;
          if (lVar5 != 0) {
            if (uVar2 != 0) {
              lVar5 = N_VGetLength(*(undefined8 *)(__s + 0xc));
              if (lVar5 < 1) {
                dVar1 = 0.0;
              }
              else {
                lVar5 = N_VGetLength(*(undefined8 *)(__s + 0xc));
                dVar1 = (double)lVar5;
                if (dVar1 < 0.0) {
                  dVar1 = sqrt(dVar1);
                }
                else {
                  dVar1 = SQRT(dVar1);
                }
              }
              *(double *)(__s + 0x1c) = dVar1;
            }
            __s[0x18] = (uint)((uVar2 - 1 & 0xfffffffd) != 0);
            *(uint **)((long)ida_mem + 0x760) = __s;
            return 0;
          }
          IDAProcessError((IDAMem)ida_mem,-4,0x12e,"IDASetLinearSolver",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/idas/idas_ls.c"
                          ,"A memory request failed.");
          N_VDestroy(*(undefined8 *)(__s + 0xc));
          uVar8 = *(undefined8 *)(__s + 0xe);
        }
        iVar6 = -4;
        N_VDestroy(uVar8);
        goto LAB_0012340e;
      }
      pcVar9 = "A memory request failed.";
      iVar6 = -4;
      iVar7 = -4;
      iVar3 = 0x119;
    }
    else {
      pcVar9 = "Error in calling SUNLinSolSetPreconditioner";
      iVar6 = -9;
      iVar7 = -9;
      iVar3 = 0x10d;
    }
  }
  else {
    pcVar9 = "Error in calling SUNLinSolSetATimes";
    iVar6 = -9;
    iVar7 = -9;
    iVar3 = 0xff;
  }
  IDAProcessError((IDAMem)ida_mem,iVar7,iVar3,"IDASetLinearSolver",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/idas/idas_ls.c"
                  ,pcVar9);
LAB_0012340e:
  free(__s);
  return iVar6;
}

Assistant:

int IDASetLinearSolver(void* ida_mem, SUNLinearSolver LS, SUNMatrix A)
{
  IDAMem IDA_mem;
  IDALsMem idals_mem;
  int retval, LSType;
  sunbooleantype iterative;   /* is the solver iterative?    */
  sunbooleantype matrixbased; /* is a matrix structure used? */

  /* Return immediately if any input is NULL */
  if (ida_mem == NULL)
  {
    IDAProcessError(NULL, IDALS_MEM_NULL, __LINE__, __func__, __FILE__,
                    MSG_LS_IDAMEM_NULL);
    return (IDALS_MEM_NULL);
  }
  if (LS == NULL)
  {
    IDAProcessError(NULL, IDALS_ILL_INPUT, __LINE__, __func__, __FILE__,
                    "LS must be non-NULL");
    return (IDALS_ILL_INPUT);
  }
  IDA_mem = (IDAMem)ida_mem;

  /* Test if solver is compatible with LS interface */
  if ((LS->ops->gettype == NULL) || (LS->ops->solve == NULL))
  {
    IDAProcessError(IDA_mem, IDALS_ILL_INPUT, __LINE__, __func__, __FILE__,
                    "LS object is missing a required operation");
    return (IDALS_ILL_INPUT);
  }

  /* Retrieve the LS type */
  LSType = SUNLinSolGetType(LS);

  /* Set flags based on LS type */
  iterative   = (LSType != SUNLINEARSOLVER_DIRECT);
  matrixbased = ((LSType != SUNLINEARSOLVER_ITERATIVE) &&
                 (LSType != SUNLINEARSOLVER_MATRIX_EMBEDDED));

  /* Test if vector is compatible with LS interface */
  if (IDA_mem->ida_tempv1->ops->nvconst == NULL ||
      IDA_mem->ida_tempv1->ops->nvwrmsnorm == NULL)
  {
    IDAProcessError(IDA_mem, IDALS_ILL_INPUT, __LINE__, __func__, __FILE__,
                    MSG_LS_BAD_NVECTOR);
    return (IDALS_ILL_INPUT);
  }

  /* Ensure that A is NULL when LS is matrix-embedded */
  if ((LSType == SUNLINEARSOLVER_MATRIX_EMBEDDED) && (A != NULL))
  {
    IDAProcessError(IDA_mem, IDALS_ILL_INPUT, __LINE__, __func__,
                    __FILE__, "Incompatible inputs: matrix-embedded LS requires NULL matrix");
    return (IDALS_ILL_INPUT);
  }

  /* Check for compatible LS type, matrix and "atimes" support */
  if (iterative)
  {
    if (IDA_mem->ida_tempv1->ops->nvgetlength == NULL)
    {
      IDAProcessError(IDA_mem, IDALS_ILL_INPUT, __LINE__, __func__, __FILE__,
                      MSG_LS_BAD_NVECTOR);
      return (IDALS_ILL_INPUT);
    }

    if (LSType != SUNLINEARSOLVER_MATRIX_EMBEDDED)
    {
      if (LS->ops->resid == NULL || LS->ops->numiters == NULL)
      {
        IDAProcessError(IDA_mem, IDALS_ILL_INPUT, __LINE__, __func__,
                        __FILE__, "Iterative LS object requires 'resid' and 'numiters' routines");
        return (IDALS_ILL_INPUT);
      }
    }

    if (!matrixbased && (LSType != SUNLINEARSOLVER_MATRIX_EMBEDDED) &&
        (LS->ops->setatimes == NULL))
    {
      IDAProcessError(IDA_mem, IDALS_ILL_INPUT, __LINE__, __func__,
                      __FILE__, "Incompatible inputs: iterative LS must support ATimes routine");
      return (IDALS_ILL_INPUT);
    }

    if (matrixbased && (A == NULL))
    {
      IDAProcessError(IDA_mem, IDALS_ILL_INPUT, __LINE__, __func__,
                      __FILE__, "Incompatible inputs: matrix-iterative LS requires non-NULL matrix");
      return (IDALS_ILL_INPUT);
    }
  }
  else if (A == NULL)
  {
    IDAProcessError(IDA_mem, IDALS_ILL_INPUT, __LINE__, __func__, __FILE__,
                    "Incompatible inputs: direct LS requires non-NULL matrix");
    return (IDALS_ILL_INPUT);
  }

  /* free any existing system solver attached to IDA */
  if (IDA_mem->ida_lfree) { IDA_mem->ida_lfree(IDA_mem); }

  /* Set four main system linear solver function fields in IDA_mem */
  IDA_mem->ida_linit  = idaLsInitialize;
  IDA_mem->ida_lsetup = idaLsSetup;
  IDA_mem->ida_lsolve = idaLsSolve;
  IDA_mem->ida_lfree  = idaLsFree;

  /* Set ida_lperf if using an iterative SUNLinearSolver object */
  IDA_mem->ida_lperf = (iterative) ? idaLsPerf : NULL;

  /* Allocate memory for IDALsMemRec */
  idals_mem = NULL;
  idals_mem = (IDALsMem)malloc(sizeof(struct IDALsMemRec));
  if (idals_mem == NULL)
  {
    IDAProcessError(IDA_mem, IDALS_MEM_FAIL, __LINE__, __func__, __FILE__,
                    MSG_LS_MEM_FAIL);
    return (IDALS_MEM_FAIL);
  }
  memset(idals_mem, 0, sizeof(struct IDALsMemRec));

  /* set SUNLinearSolver pointer */
  idals_mem->LS = LS;

  /* Linear solver type information */
  idals_mem->iterative   = iterative;
  idals_mem->matrixbased = matrixbased;

  /* Set defaults for Jacobian-related fields */
  idals_mem->J = A;
  if (A != NULL)
  {
    idals_mem->jacDQ  = SUNTRUE;
    idals_mem->jac    = idaLsDQJac;
    idals_mem->J_data = IDA_mem;
  }
  else
  {
    idals_mem->jacDQ  = SUNFALSE;
    idals_mem->jac    = NULL;
    idals_mem->J_data = NULL;
  }
  idals_mem->jtimesDQ = SUNTRUE;
  idals_mem->jtsetup  = NULL;
  idals_mem->jtimes   = idaLsDQJtimes;
  idals_mem->jt_res   = IDA_mem->ida_res;
  idals_mem->jt_data  = IDA_mem;

  /* Set defaults for preconditioner-related fields */
  idals_mem->pset   = NULL;
  idals_mem->psolve = NULL;
  idals_mem->pfree  = NULL;
  idals_mem->pdata  = IDA_mem->ida_user_data;

  /* Initialize counters */
  idaLsInitializeCounters(idals_mem);

  /* Set default values for the rest of the Ls parameters */
  idals_mem->eplifac   = PT05;
  idals_mem->dqincfac  = ONE;
  idals_mem->last_flag = IDALS_SUCCESS;

  /* If LS supports ATimes, attach IDALs routine */
  if (LS->ops->setatimes)
  {
    retval = SUNLinSolSetATimes(LS, IDA_mem, idaLsATimes);
    if (retval != SUN_SUCCESS)
    {
      IDAProcessError(IDA_mem, IDALS_SUNLS_FAIL, __LINE__, __func__, __FILE__,
                      "Error in calling SUNLinSolSetATimes");
      free(idals_mem);
      idals_mem = NULL;
      return (IDALS_SUNLS_FAIL);
    }
  }

  /* If LS supports preconditioning, initialize pset/psol to NULL */
  if (LS->ops->setpreconditioner)
  {
    retval = SUNLinSolSetPreconditioner(LS, IDA_mem, NULL, NULL);
    if (retval != SUN_SUCCESS)
    {
      IDAProcessError(IDA_mem, IDALS_SUNLS_FAIL, __LINE__, __func__, __FILE__,
                      "Error in calling SUNLinSolSetPreconditioner");
      free(idals_mem);
      idals_mem = NULL;
      return (IDALS_SUNLS_FAIL);
    }
  }

  /* Allocate memory for ytemp, yptemp and x */
  idals_mem->ytemp = N_VClone(IDA_mem->ida_tempv1);
  if (idals_mem->ytemp == NULL)
  {
    IDAProcessError(IDA_mem, IDALS_MEM_FAIL, __LINE__, __func__, __FILE__,
                    MSG_LS_MEM_FAIL);
    free(idals_mem);
    idals_mem = NULL;
    return (IDALS_MEM_FAIL);
  }

  idals_mem->yptemp = N_VClone(IDA_mem->ida_tempv1);
  if (idals_mem->yptemp == NULL)
  {
    IDAProcessError(IDA_mem, IDALS_MEM_FAIL, __LINE__, __func__, __FILE__,
                    MSG_LS_MEM_FAIL);
    N_VDestroy(idals_mem->ytemp);
    free(idals_mem);
    idals_mem = NULL;
    return (IDALS_MEM_FAIL);
  }

  idals_mem->x = N_VClone(IDA_mem->ida_tempv1);
  if (idals_mem->x == NULL)
  {
    IDAProcessError(IDA_mem, IDALS_MEM_FAIL, __LINE__, __func__, __FILE__,
                    MSG_LS_MEM_FAIL);
    N_VDestroy(idals_mem->ytemp);
    N_VDestroy(idals_mem->yptemp);
    free(idals_mem);
    idals_mem = NULL;
    return (IDALS_MEM_FAIL);
  }

  /* For iterative LS, compute sqrtN */
  if (iterative)
  {
    idals_mem->nrmfac = SUNRsqrt(N_VGetLength(idals_mem->ytemp));
  }

  /* For matrix-based LS, enable solution scaling */
  if (matrixbased) { idals_mem->scalesol = SUNTRUE; }
  else { idals_mem->scalesol = SUNFALSE; }

  /* Attach linear solver memory to integrator memory */
  IDA_mem->ida_lmem = idals_mem;

  return (IDALS_SUCCESS);
}